

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

bool __thiscall duckdb::ARTKey::operator==(ARTKey *this,ARTKey *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = this->len;
  if (uVar1 != key->len) {
    return false;
  }
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    if (*this->data == *key->data) {
      uVar2 = 1;
      do {
        uVar3 = uVar2;
        if (uVar1 == uVar3) break;
        uVar2 = uVar3 + 1;
      } while (this->data[uVar3] == key->data[uVar3]);
      bVar4 = uVar1 <= uVar3;
    }
  }
  return bVar4;
}

Assistant:

bool ARTKey::operator==(const ARTKey &key) const {
	if (len != key.len) {
		return false;
	}
	for (idx_t i = 0; i < len; i++) {
		if (data[i] != key.data[i]) {
			return false;
		}
	}
	return true;
}